

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

lua_State * lua_newthread(lua_State *L)

{
  lua_State *L_00;
  int iVar1;
  global_State *g;
  StkId pTVar2;
  undefined8 *puVar3;
  
  g = L->l_G;
  if (0 < g->GCdebt) {
    luaC_step(L);
  }
  puVar3 = (undefined8 *)luaM_realloc_(L,(void *)0x0,8,0xd8);
  L_00 = (lua_State *)(puVar3 + 1);
  *(byte *)((long)puVar3 + 0x11) = g->currentwhite & 3;
  *(undefined1 *)(puVar3 + 2) = 8;
  puVar3[1] = g->allgc;
  g->allgc = (GCObject *)L_00;
  pTVar2 = L->top;
  (pTVar2->value_).gc = (GCObject *)L_00;
  pTVar2->tt_ = 0x48;
  L->top = L->top + 1;
  preinit_thread(L_00,g);
  *(sig_atomic_t *)(puVar3 + 0x1a) = L->hookmask;
  iVar1 = L->basehookcount;
  *(int *)((long)puVar3 + 0xc4) = iVar1;
  puVar3[0x16] = L->hook;
  *(int *)(puVar3 + 0x19) = iVar1;
  *puVar3 = *(undefined8 *)&g->mainthread[-1].hookmask;
  stack_init(L_00,L);
  return L_00;
}

Assistant:

LUA_API lua_State *lua_newthread(lua_State *L) {
    global_State *g = G(L);
    lua_State *L1;
    lua_lock(L);
    luaC_checkGC(L);
    /* create new thread */
    L1 = &cast(LX *, luaM_newobject(L, LUA_TTHREAD, sizeof(LX)))->l;
    L1->marked = luaC_white(g);
    L1->tt = LUA_TTHREAD;
    /* link it on list 'allgc' */
    L1->next = g->allgc;
    g->allgc = obj2gco(L1);
    /* anchor it on L stack */
    setthvalue(L, L->top, L1);
    api_incr_top(L);
    preinit_thread(L1, g);
    L1->hookmask = L->hookmask;
    L1->basehookcount = L->basehookcount;
    L1->hook = L->hook;
    resethookcount(L1);
    /* initialize L1 extra space */
    memcpy(lua_getextraspace(L1), lua_getextraspace(g->mainthread),
           LUA_EXTRASPACE);
    luai_userstatethread(L, L1);
    stack_init(L1, L);  /* init stack */
    lua_unlock(L);
    return L1;
}